

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O3

void __thiscall
Atari2600::TIA::draw_object_visible<Atari2600::TIA::Ball>
          (TIA *this,Ball *object,uint8_t collision_identity,int start,int end,int time_now)

{
  int *piVar1;
  ulong uVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  
  if (start < end) {
    iVar10 = (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.motion_time +
             -0x40;
    do {
      iVar4 = end;
      if (iVar10 < end) {
        iVar4 = iVar10;
      }
      if ((object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.is_moving ==
          false) {
        iVar4 = end;
      }
      uVar6 = (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.position;
      uVar8 = object->copy_flags;
      iVar11 = 0xa0;
      if ((uVar8 != 0) && (iVar11 = 0x10, ((byte)uVar8 & (int)uVar6 < 0x10) == 0)) {
        if ((int)uVar6 < 0x20) {
          iVar11 = 0x20;
          if ((uVar8 & 2) == 0) {
LAB_002fb5bc:
            iVar11 = 0x40;
            if ((uVar8 & 4) == 0) {
              iVar11 = 0xa0;
            }
          }
        }
        else {
          iVar11 = 0xa0;
          if (uVar6 < 0x40) goto LAB_002fb5bc;
        }
      }
      iVar5 = (iVar11 + start) - uVar6;
      iVar11 = iVar4;
      if (iVar5 < iVar4) {
        iVar11 = iVar5;
      }
      uVar6 = iVar11 - start;
      if (((object->super_HorizontalRun).enqueues == true) && (time_now < iVar11)) {
        uVar8 = time_now - start;
        if ((uVar8 != 0 && start <= time_now) &&
           (iVar7 = (object->super_HorizontalRun).pixel_position, iVar7 != 0)) {
          if ((&(object->super_HorizontalRun).field_0x1d)[object->enabled_index] == '\x01') {
            if (0 < (int)uVar8) {
              lVar9 = 200;
              do {
                pbVar3 = (byte *)((long)&(this->crt_).time_multiplier_ + lVar9 + start);
                *pbVar3 = *pbVar3 | collision_identity;
                piVar1 = &(object->super_HorizontalRun).pixel_position;
                *piVar1 = *piVar1 + -1;
                if (*piVar1 == 0) break;
                uVar2 = lVar9 - 199;
                lVar9 = lVar9 + 1;
              } while (uVar2 < uVar8);
            }
          }
          else {
            iVar7 = iVar7 - uVar8;
LAB_002fb68c:
            if (iVar7 < 1) {
              iVar7 = 0;
            }
            (object->super_HorizontalRun).pixel_position = iVar7;
          }
        }
      }
      else {
        iVar7 = (object->super_HorizontalRun).pixel_position;
        if (iVar7 != 0) {
          if ((&(object->super_HorizontalRun).field_0x1d)[object->enabled_index] != '\x01') {
            iVar7 = iVar7 - uVar6;
            goto LAB_002fb68c;
          }
          if (0 < (int)uVar6) {
            lVar9 = 200;
            do {
              pbVar3 = (byte *)((long)&(this->crt_).time_multiplier_ + lVar9 + start);
              *pbVar3 = *pbVar3 | collision_identity;
              piVar1 = &(object->super_HorizontalRun).pixel_position;
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) break;
              uVar2 = lVar9 - 199;
              lVar9 = lVar9 + 1;
            } while (uVar2 < uVar6);
          }
        }
      }
      (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.position =
           (int)(uVar6 + (object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.
                         position) % 0xa0;
      if (((object->super_HorizontalRun).super_Object<Atari2600::TIA::HorizontalRun>.is_moving ==
           true) && (iVar11 == iVar10)) {
        perform_motion_step<Atari2600::TIA::Ball>(this,object);
        iVar10 = iVar10 + 4;
      }
      else if (iVar5 <= iVar4) {
        (object->super_HorizontalRun).pixel_position = (object->super_HorizontalRun).size;
      }
      start = iVar11;
    } while (iVar11 < end);
  }
  return;
}

Assistant:

void TIA::draw_object_visible(T &object, const uint8_t collision_identity, int start, int end, int time_now) {
	// perform a miniature event loop on (i) triggering draws; (ii) drawing; and (iii) motion
	int next_motion_time = object.motion_time - first_pixel_cycle + 4;
	while(start < end) {
		int next_event_time = end;

		// is the next event a movement tick?
		if(object.is_moving && next_motion_time < next_event_time) {
			next_event_time = next_motion_time;
		}

		// is the next event a graphics trigger?
		int next_copy = 160;
		int next_copy_id = 0;
		if(object.copy_flags) {
			if(object.position < 16 && object.copy_flags&1) {
				next_copy = 16;
				next_copy_id = 1;
			} else if(object.position < 32 && object.copy_flags&2) {
				next_copy = 32;
				next_copy_id = 2;
			} else if(object.position < 64 && object.copy_flags&4) {
				next_copy = 64;
				next_copy_id = 3;
			}
		}

		int next_copy_time = start + next_copy - object.position;
		if(next_copy_time < next_event_time) next_event_time = next_copy_time;

		// the decision is to progress by length
		const int length = next_event_time - start;

		// enqueue a future intention to draw pixels if spitting them out now would violate accuracy;
		// otherwise draw them now
		if(object.enqueues && next_event_time > time_now) {
			if(start < time_now) {
				object.output_pixels(&collision_buffer_[start], time_now - start, collision_identity, start + first_pixel_cycle - 4);
				object.enqueue_pixels(time_now, next_event_time, time_now + first_pixel_cycle - 4);
			} else {
				object.enqueue_pixels(start, next_event_time, start + first_pixel_cycle - 4);
			}
		} else {
			object.output_pixels(&collision_buffer_[start], length, collision_identity, start + first_pixel_cycle - 4);
		}

		// the next interesting event is after next_event_time cycles, so progress
		object.position = (object.position + length) % 160;
		start = next_event_time;

		// if the event is a motion tick, apply; if it's a draw trigger, trigger a draw
		if(object.is_moving && start == next_motion_time) {
			perform_motion_step(object);
			next_motion_time += 4;
		} else if(start == next_copy_time) {
			object.reset_pixels(next_copy_id);
		}
	}
}